

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_intersector.cpp
# Opt level: O1

bool embree::sse42::InstanceIntersector1::pointQuery
               (PointQuery *query,PointQueryContext *context,InstancePrimitive *prim)

{
  float (*pafVar1) [16];
  float *pfVar2;
  undefined1 auVar3 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  Instance *pIVar6;
  AffineSpace3ff *pAVar7;
  RTCPointQueryContext *pRVar8;
  long lVar9;
  undefined1 uVar10;
  uint uVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float __x;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar39;
  undefined1 auVar38 [16];
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  undefined8 local_138;
  undefined8 local_130;
  float local_128;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 local_90;
  PointQuery *local_88;
  int local_80;
  PointQueryFunction local_78;
  RTCPointQueryContext *pRStack_70;
  float local_68;
  void *local_60;
  undefined8 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  pIVar6 = prim->instance;
  pAVar7 = pIVar6->local2world;
  if ((pIVar6->super_Geometry).field_8.field_0x1 == '\x01') {
    fVar13 = (pAVar7->p).field_0.m128[3];
    fVar24 = (pAVar7->l).vx.field_0.m128[3];
    fVar48 = (pAVar7->l).vy.field_0.m128[3];
    fVar49 = (pAVar7->l).vz.field_0.m128[3];
    aVar4 = (pAVar7->l).vx.field_0.field_1;
    fVar45 = aVar4.x;
    fVar33 = fVar24 * fVar48 + fVar13 * fVar49;
    fVar14 = fVar24 * fVar48 - fVar13 * fVar49;
    fVar18 = fVar13 * fVar13 + fVar24 * fVar24 + -fVar48 * fVar48 + -fVar49 * fVar49;
    fVar28 = fVar13 * fVar13 - fVar24 * fVar24;
    fVar27 = fVar48 * fVar48 + fVar28 + -fVar49 * fVar49;
    fVar40 = fVar24 * fVar49 - fVar13 * fVar48;
    fVar22 = fVar13 * fVar48 + fVar24 * fVar49;
    fVar34 = fVar48 * fVar49 + fVar13 * fVar24;
    fVar13 = fVar48 * fVar49 - fVar13 * fVar24;
    aVar5 = (pAVar7->l).vy.field_0.field_1;
    fVar25 = aVar5.x;
    fVar26 = aVar5.y;
    fVar33 = fVar33 + fVar33;
    fVar40 = fVar40 + fVar40;
    fVar24 = fVar49 * fVar49 + fVar28 + -fVar48 * fVar48;
    fVar29 = fVar18 * 1.0 + fVar33 * 0.0 + fVar40 * 0.0;
    fVar30 = fVar18 * 0.0 + fVar33 * 1.0 + fVar40 * 0.0;
    fVar31 = fVar18 * 0.0 + fVar33 * 0.0 + fVar40 * 1.0;
    fVar32 = fVar18 * 0.0 + fVar33 * 0.0 + fVar40 * 0.0;
    fVar40 = (pAVar7->l).vz.field_0.m128[0];
    fVar41 = (pAVar7->l).vz.field_0.m128[1];
    fVar42 = (pAVar7->l).vz.field_0.m128[2];
    fVar34 = fVar34 + fVar34;
    fVar43 = (pAVar7->p).field_0.m128[0];
    fVar37 = (pAVar7->p).field_0.m128[1];
    fVar39 = (pAVar7->p).field_0.m128[2];
    fVar14 = fVar14 + fVar14;
    fVar15 = fVar14 * 1.0 + fVar27 * 0.0 + fVar34 * 0.0;
    fVar16 = fVar14 * 0.0 + fVar27 * 1.0 + fVar34 * 0.0;
    fVar17 = fVar14 * 0.0 + fVar27 * 0.0 + fVar34 * 1.0;
    fVar27 = fVar14 * 0.0 + fVar27 * 0.0 + fVar34 * 0.0;
    auVar38._0_8_ = aVar4._4_8_;
    auVar38._8_8_ = 0;
    auVar38 = blendps(auVar38,(undefined1  [16])aVar5,4);
    fVar22 = fVar22 + fVar22;
    fVar13 = fVar13 + fVar13;
    fVar34 = fVar22 * 1.0 + fVar13 * 0.0 + fVar24 * 0.0;
    fVar35 = fVar22 * 0.0 + fVar13 * 1.0 + fVar24 * 0.0;
    fVar36 = fVar22 * 0.0 + fVar13 * 0.0 + fVar24 * 1.0;
    fVar44 = fVar22 * 0.0 + fVar13 * 0.0 + fVar24 * 0.0;
    fVar13 = fVar45 * fVar29 + fVar15 * 0.0 + fVar34 * 0.0;
    fVar24 = fVar45 * fVar30 + fVar16 * 0.0 + fVar35 * 0.0;
    fVar48 = fVar45 * fVar31 + fVar17 * 0.0 + fVar36 * 0.0;
    fVar49 = fVar45 * fVar32 + fVar27 * 0.0 + fVar44 * 0.0;
    fVar14 = fVar25 * fVar29 + fVar26 * fVar15 + fVar34 * 0.0;
    fVar18 = fVar25 * fVar30 + fVar26 * fVar16 + fVar35 * 0.0;
    fVar22 = fVar25 * fVar31 + fVar26 * fVar17 + fVar36 * 0.0;
    fVar25 = fVar25 * fVar32 + fVar26 * fVar27 + fVar44 * 0.0;
    fVar26 = fVar40 * fVar29 + fVar41 * fVar15 + fVar42 * fVar34;
    fVar28 = fVar40 * fVar30 + fVar41 * fVar16 + fVar42 * fVar35;
    fVar33 = fVar40 * fVar31 + fVar41 * fVar17 + fVar42 * fVar36;
    fVar40 = fVar40 * fVar32 + fVar41 * fVar27 + fVar42 * fVar44;
    fVar41 = fVar43 * fVar29 + fVar37 * fVar15 + fVar39 * fVar34 + auVar38._0_4_ + 0.0;
    fVar42 = fVar43 * fVar30 + fVar37 * fVar16 + fVar39 * fVar35 + auVar38._4_4_ + 0.0;
    fVar15 = fVar43 * fVar31 + fVar37 * fVar17 + fVar39 * fVar36 + auVar38._8_4_ + 0.0;
    fVar43 = fVar43 * fVar32 + fVar37 * fVar27 + fVar39 * fVar44 + auVar38._12_4_ + 0.0;
  }
  else {
    fVar13 = (pAVar7->l).vx.field_0.m128[0];
    fVar24 = (pAVar7->l).vx.field_0.m128[1];
    fVar48 = (pAVar7->l).vx.field_0.m128[2];
    fVar49 = (pAVar7->l).vx.field_0.m128[3];
    fVar14 = (pAVar7->l).vy.field_0.m128[0];
    fVar18 = (pAVar7->l).vy.field_0.m128[1];
    fVar22 = (pAVar7->l).vy.field_0.m128[2];
    fVar25 = (pAVar7->l).vy.field_0.m128[3];
    fVar26 = (pAVar7->l).vz.field_0.m128[0];
    fVar28 = (pAVar7->l).vz.field_0.m128[1];
    fVar33 = (pAVar7->l).vz.field_0.m128[2];
    fVar40 = (pAVar7->l).vz.field_0.m128[3];
    fVar41 = (pAVar7->p).field_0.m128[0];
    fVar42 = (pAVar7->p).field_0.m128[1];
    fVar15 = (pAVar7->p).field_0.m128[2];
    fVar43 = (pAVar7->p).field_0.m128[3];
  }
  auVar38 = *(undefined1 (*) [16])(pIVar6->world2local0).l.vx.field_0.m128;
  fVar27 = auVar38._0_4_;
  fVar29 = auVar38._4_4_;
  fVar30 = auVar38._8_4_;
  fVar31 = auVar38._12_4_;
  auVar20 = *(undefined1 (*) [16])(pIVar6->world2local0).l.vy.field_0.m128;
  fVar32 = auVar20._0_4_;
  fVar34 = auVar20._4_4_;
  fVar35 = auVar20._8_4_;
  fVar36 = auVar20._12_4_;
  auVar3 = *(undefined1 (*) [16])(pIVar6->world2local0).l.vz.field_0.m128;
  fVar44 = auVar3._0_4_;
  fVar45 = auVar3._4_4_;
  fVar46 = auVar3._8_4_;
  fVar47 = auVar3._12_4_;
  fVar37 = (pIVar6->world2local0).p.field_0.m128[0];
  fVar39 = (pIVar6->world2local0).p.field_0.m128[1];
  fVar16 = (pIVar6->world2local0).p.field_0.m128[2];
  fVar17 = (pIVar6->world2local0).p.field_0.m128[3];
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar19 = dpps(auVar38,auVar20,0x7f);
    local_68 = 0.0;
    if (((1e-05 < ABS(auVar19._0_4_)) ||
        (auVar19 = dpps(auVar38,auVar3,0x7f), 1e-05 < ABS(auVar19._0_4_))) ||
       (auVar19 = dpps(auVar20,auVar3,0x7f), 1e-05 < ABS(auVar19._0_4_))) {
      bVar12 = false;
    }
    else {
      auVar19 = dpps(auVar38,auVar38,0x7f);
      auVar23 = dpps(auVar20,auVar20,0x7f);
      __x = auVar19._0_4_;
      bVar12 = false;
      if (ABS(__x - auVar23._0_4_) <= 1e-05) {
        auVar19 = dpps(auVar3,auVar3,0x7f);
        bVar12 = false;
        if ((ABS(__x - auVar19._0_4_) <= 1e-05) &&
           (fVar21 = ABS(auVar23._0_4_ - auVar19._0_4_), bVar12 = fVar21 <= 1e-05, fVar21 <= 1e-05))
        {
          bVar12 = true;
          if (__x < 0.0) {
            _local_118 = auVar3;
            local_108 = fVar37;
            fStack_104 = fVar39;
            fStack_100 = fVar16;
            fStack_fc = fVar17;
            _local_f8 = auVar20;
            _local_e8 = auVar38;
            local_d8 = fVar14;
            fStack_d4 = fVar18;
            fStack_d0 = fVar22;
            fStack_cc = fVar25;
            local_c8 = fVar41;
            fStack_c4 = fVar42;
            fStack_c0 = fVar15;
            fStack_bc = fVar43;
            local_b8 = fVar26;
            fStack_b4 = fVar28;
            fStack_b0 = fVar33;
            fStack_ac = fVar40;
            local_a8 = fVar13;
            fStack_a4 = fVar24;
            fStack_a0 = fVar48;
            fStack_9c = fVar49;
            local_68 = sqrtf(__x);
            fVar27 = (float)local_e8._0_4_;
            fVar29 = (float)local_e8._4_4_;
            fVar30 = fStack_e0;
            fVar31 = fStack_dc;
            fVar32 = (float)local_f8._0_4_;
            fVar34 = (float)local_f8._4_4_;
            fVar35 = fStack_f0;
            fVar36 = fStack_ec;
            fVar14 = local_d8;
            fVar18 = fStack_d4;
            fVar22 = fStack_d0;
            fVar25 = fStack_cc;
            fVar26 = local_b8;
            fVar28 = fStack_b4;
            fVar33 = fStack_b0;
            fVar40 = fStack_ac;
            fVar41 = local_c8;
            fVar42 = fStack_c4;
            fVar15 = fStack_c0;
            fVar43 = fStack_bc;
            fVar44 = (float)local_118._0_4_;
            fVar45 = (float)local_118._4_4_;
            fVar46 = fStack_110;
            fVar47 = fStack_10c;
            fVar13 = local_a8;
            fVar24 = fStack_a4;
            fVar48 = fStack_a0;
            fVar49 = fStack_9c;
            fVar37 = local_108;
            fVar39 = fStack_104;
            fVar16 = fStack_100;
            fVar17 = fStack_fc;
          }
          else {
            local_68 = SQRT(__x);
          }
        }
      }
    }
    local_80 = 2 - (uint)bVar12;
  }
  else {
    local_80 = 2;
    local_68 = 0.0;
  }
  pRVar8 = context->userContext;
  uVar11 = pRVar8->instStackSize;
  pRVar8->instID[uVar11] = prim->instID_;
  pRVar8->instPrimID[uVar11] = 0;
  pafVar1 = pRVar8->world2inst + uVar11;
  (*pafVar1)[0] = fVar27;
  (*pafVar1)[1] = fVar29;
  (*pafVar1)[2] = fVar30;
  (*pafVar1)[3] = fVar31;
  pfVar2 = pRVar8->world2inst[uVar11] + 4;
  *pfVar2 = fVar32;
  pfVar2[1] = fVar34;
  pfVar2[2] = fVar35;
  pfVar2[3] = fVar36;
  pfVar2 = pRVar8->world2inst[uVar11] + 8;
  *pfVar2 = fVar44;
  pfVar2[1] = fVar45;
  pfVar2[2] = fVar46;
  pfVar2[3] = fVar47;
  pfVar2 = pRVar8->world2inst[uVar11] + 0xc;
  *pfVar2 = fVar37;
  pfVar2[1] = fVar39;
  pfVar2[2] = fVar16;
  pfVar2[3] = fVar17;
  pafVar1 = pRVar8->inst2world + uVar11;
  (*pafVar1)[0] = fVar13;
  (*pafVar1)[1] = fVar24;
  (*pafVar1)[2] = fVar48;
  (*pafVar1)[3] = fVar49;
  pfVar2 = pRVar8->inst2world[uVar11] + 4;
  *pfVar2 = fVar14;
  pfVar2[1] = fVar18;
  pfVar2[2] = fVar22;
  pfVar2[3] = fVar25;
  pfVar2 = pRVar8->inst2world[uVar11] + 8;
  *pfVar2 = fVar26;
  pfVar2[1] = fVar28;
  pfVar2[2] = fVar33;
  pfVar2[3] = fVar40;
  pfVar2 = pRVar8->inst2world[uVar11] + 0xc;
  *pfVar2 = fVar41;
  pfVar2[1] = fVar42;
  pfVar2[2] = fVar15;
  pfVar2[3] = fVar43;
  pRVar8->instStackSize = pRVar8->instStackSize + 1;
  fVar13 = (query->p).field_0.field_0.x;
  fVar24 = (query->p).field_0.field_0.y;
  fVar48 = (query->p).field_0.field_0.z;
  auVar20._0_8_ =
       CONCAT44(fVar13 * fVar29 + fVar24 * fVar34 + fVar48 * fVar45 + fVar39,
                fVar13 * fVar27 + fVar24 * fVar32 + fVar48 * fVar44 + fVar37);
  auVar20._8_4_ = fVar13 * fVar30 + fVar24 * fVar35 + fVar48 * fVar46 + fVar16;
  auVar20._12_4_ = fVar13 * fVar31 + fVar24 * fVar36 + fVar48 * fVar47 + fVar17;
  local_130 = extractps(auVar20,2);
  local_128 = query->radius * local_68;
  local_98 = *(undefined8 *)&(pIVar6->super_Geometry).field_0x58;
  local_88 = context->query_ws;
  local_60 = context->userPtr;
  local_90 = 0;
  local_78 = context->func;
  pRStack_70 = context->userContext;
  local_58 = 0xffffffffffffffff;
  local_48 = local_88->radius;
  fVar13 = local_88->radius;
  local_138 = auVar20._0_8_;
  if (local_80 == 2) {
    fStack_44 = fVar13;
    fStack_40 = fVar13;
    fStack_3c = fVar13;
    if ((fVar13 < INFINITY) && (pRStack_70->instStackSize != 0)) {
      fStack_44 = local_48;
      fStack_40 = local_48;
      fStack_3c = local_48;
      pointQuery();
      fVar13 = local_38;
      fStack_44 = fStack_34;
      fStack_40 = fStack_30;
      fStack_3c = fStack_2c;
    }
  }
  else {
    fVar13 = local_68 * fVar13;
    fStack_44 = fVar13;
    fStack_40 = fVar13;
    fStack_3c = fVar13;
  }
  lVar9 = *(long *)&(pIVar6->super_Geometry).field_0x58;
  local_48 = fVar13;
  uVar10 = (**(code **)(lVar9 + 0x88))(lVar9 + 0x58,&local_138);
  pRVar8 = context->userContext;
  uVar11 = pRVar8->instStackSize - 1;
  pRVar8->instStackSize = uVar11;
  pRVar8->instID[uVar11] = 0xffffffff;
  pRVar8->instPrimID[pRVar8->instStackSize] = 0xffffffff;
  return (bool)uVar10;
}

Assistant:

bool InstanceIntersector1::pointQuery(PointQuery* query, PointQueryContext* context, const InstancePrimitive& prim)
    {
      const Instance* instance = prim.instance;

      const AffineSpace3fa local2world = instance->getLocal2World();
      const AffineSpace3fa world2local = instance->getWorld2Local();
      float similarityScale = 0.f;
      const bool similtude = context->query_type == POINT_QUERY_TYPE_SPHERE
                           && similarityTransform(world2local, &similarityScale);
      assert((similtude && similarityScale > 0) || !similtude);

      if (likely(instance_id_stack::push(context->userContext, prim.instID_, 0, world2local, local2world)))
      {
        PointQuery query_inst;
        query_inst.time = query->time;
        query_inst.p = xfmPoint(world2local, query->p); 
        query_inst.radius = query->radius * similarityScale;

        PointQueryContext context_inst(
          (Scene*)instance->object, 
          context->query_ws, 
          similtude ? POINT_QUERY_TYPE_SPHERE : POINT_QUERY_TYPE_AABB,
          context->func,
          context->userContext,
          similarityScale,
          context->userPtr);

        bool changed = instance->object->intersectors.pointQuery(&query_inst, &context_inst);
        instance_id_stack::pop(context->userContext);
        return changed;
      }
      return false;
    }